

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChValueSpecific<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::ChValueSpecific
          (ChValueSpecific<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *this,
          Matrix<double,__1,__1,_1,__1,__1> *mvalp,char *mname,char flags)

{
  char flags_local;
  char *mname_local;
  Matrix<double,__1,__1,_1,__1,__1> *mvalp_local;
  ChValueSpecific<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *this_local;
  
  ChValue::ChValue(&this->super_ChValue);
  (this->super_ChValue)._vptr_ChValue = (_func_int **)&PTR__ChValueSpecific_001d7e60;
  this->_ptr_to_val = mvalp;
  std::__cxx11::string::operator=((string *)&(this->super_ChValue)._name,mname);
  (this->super_ChValue)._flags = flags;
  return;
}

Assistant:

ChValueSpecific(TClass& mvalp, const char* mname, char flags) { 
          _ptr_to_val = (TClass*)(& mvalp);
          _name = mname;
          _flags = flags;
      }